

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O3

int CVodeSetMinStep(void *cvode_mem,sunrealtype hmin)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x133;
  }
  else {
    if (0.0 <= hmin) {
      if ((hmin != 0.0) || (NAN(hmin))) {
        if (1.0 < *(double *)((long)cvode_mem + 0x5c0) * hmin) {
          msgfmt = "Inconsistent step size limits: hmin > hmax.";
          iVar1 = -0x16;
          error_code = -0x16;
          line = 0x149;
          goto LAB_00123836;
        }
        *(sunrealtype *)((long)cvode_mem + 0x5b8) = hmin;
      }
      else {
        *(undefined8 *)((long)cvode_mem + 0x5b8) = 0;
      }
      return 0;
    }
    msgfmt = "hmin < 0 illegal.";
    iVar1 = -0x16;
    error_code = -0x16;
    line = 0x13b;
  }
LAB_00123836:
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetMinStep",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeSetMinStep(void* cvode_mem, sunrealtype hmin)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (hmin < ZERO)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NEG_HMIN);
    return (CV_ILL_INPUT);
  }

  /* Passing 0 sets hmin = zero */
  if (hmin == ZERO)
  {
    cv_mem->cv_hmin = HMIN_DEFAULT;
    return (CV_SUCCESS);
  }

  if (hmin * cv_mem->cv_hmax_inv > ONE)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_HMIN_HMAX);
    return (CV_ILL_INPUT);
  }

  cv_mem->cv_hmin = hmin;

  return (CV_SUCCESS);
}